

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  unsigned_short uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  unsigned_short *puVar5;
  undefined8 extraout_RAX;
  long in_RCX;
  uint in_EDX;
  uint64 fl;
  uint f;
  uint i_2;
  uint i_1;
  uint i;
  uint max_freq;
  vector<unsigned_short> sym_freq16;
  uint in_stack_ffffffffffffff5c;
  vector<unsigned_short> *in_stack_ffffffffffffff60;
  ulong local_68;
  uint local_58;
  uint local_54;
  uint local_40;
  uint local_3c;
  vector<unsigned_short> local_38;
  long local_20;
  uint local_18;
  byte local_11;
  static_huffman_data_model *local_10;
  byte local_1;
  
  local_11 = (byte)ctx & 1;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_10 = this;
  vector<unsigned_short>::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  local_3c = 0;
  for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
    local_3c = math::maximum<unsigned_int>(local_3c,*(uint *)(local_20 + (ulong)local_40 * 4));
  }
  if (local_3c == 0) {
    local_1 = 0;
  }
  else {
    if (local_3c < 0x10000) {
      for (local_54 = 0; local_54 < local_18; local_54 = local_54 + 1) {
        uVar1 = *(unsigned_short *)(local_20 + (ulong)local_54 * 4);
        puVar5 = vector<unsigned_short>::operator[](&local_38,local_54);
        *puVar5 = uVar1;
      }
    }
    else {
      for (local_58 = 0; local_58 < local_18; local_58 = local_58 + 1) {
        uVar2 = *(uint *)(local_20 + (ulong)local_58 * 4);
        if (uVar2 != 0) {
          local_68 = ((ulong)uVar2 * 0xffff + (ulong)(local_3c >> 1)) / (ulong)local_3c;
          if (local_68 == 0) {
            local_68 = 1;
          }
          puVar5 = vector<unsigned_short>::operator[](&local_38,local_58);
          *puVar5 = (unsigned_short)local_68;
        }
      }
    }
    bVar3 = local_11;
    in_stack_ffffffffffffff60 =
         (vector<unsigned_short> *)vector<unsigned_short>::operator[](&local_38,0);
    iVar4 = init(this,(EVP_PKEY_CTX *)(ulong)(bVar3 & 1));
    local_1 = (byte)iVar4 & 1;
  }
  vector<unsigned_short>::~vector(in_stack_ffffffffffffff60);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint* pSym_freq, uint code_size_limit) {
  CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

  crnlib::vector<uint16> sym_freq16(total_syms);

  uint max_freq = 0;
  for (uint i = 0; i < total_syms; i++)
    max_freq = math::maximum(max_freq, pSym_freq[i]);

  if (!max_freq)
    return false;

  if (max_freq <= cUINT16_MAX) {
    for (uint i = 0; i < total_syms; i++)
      sym_freq16[i] = static_cast<uint16>(pSym_freq[i]);
  } else {
    for (uint i = 0; i < total_syms; i++) {
      uint f = pSym_freq[i];
      if (!f)
        continue;

      uint64 fl = f;

      fl = ((fl << 16) - fl) + (max_freq >> 1);
      fl /= max_freq;
      if (fl < 1)
        fl = 1;

      CRNLIB_ASSERT(fl <= cUINT16_MAX);

      sym_freq16[i] = static_cast<uint16>(fl);
    }
  }

  return init(encoding, total_syms, &sym_freq16[0], code_size_limit);
}